

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

int evfilt_write_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  byte *pbVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uintptr_t uVar7;
  short sVar8;
  unsigned_short uVar9;
  int iVar10;
  uint uVar11;
  undefined8 in_RAX;
  uint *__optval;
  ushort uVar12;
  socklen_t slen;
  int serr;
  socklen_t local_28;
  uint local_24;
  
  _local_28 = CONCAT44((uint)((ulong)in_RAX >> 0x20),4);
  epoll_event_dump((epoll_event *)ptr);
  uVar7 = (src->kev).ident;
  uVar3 = *(undefined4 *)((long)&(src->kev).ident + 4);
  sVar8 = (src->kev).filter;
  uVar9 = (src->kev).flags;
  uVar11 = (src->kev).fflags;
  uVar4 = *(undefined4 *)((long)&(src->kev).data + 4);
  uVar5 = *(undefined4 *)&(src->kev).udata;
  uVar6 = *(undefined4 *)((long)&(src->kev).udata + 4);
  *(int *)&dst->data = (int)(src->kev).data;
  *(undefined4 *)((long)&dst->data + 4) = uVar4;
  *(undefined4 *)&dst->udata = uVar5;
  *(undefined4 *)((long)&dst->udata + 4) = uVar6;
  *(int *)&dst->ident = (int)uVar7;
  *(undefined4 *)((long)&dst->ident + 4) = uVar3;
  dst->filter = sVar8;
  dst->flags = uVar9;
  dst->fflags = uVar11;
  uVar11 = src->kn_flags;
  if ((uVar11 & 1) == 0) {
    uVar2 = *ptr;
    if ((uVar2 & 0x10) != 0) {
      pbVar1 = (byte *)((long)&dst->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((uVar2 & 8) == 0) {
      if (-1 < (short)dst->flags) {
        iVar10 = ioctl((int)dst->ident,0x5411,&dst->data);
        if (iVar10 < 0) {
          dst->data = 0;
        }
      }
    }
    else {
      if ((uVar11 & 0x3e0) == 0) {
        uVar11 = 5;
      }
      else {
        __optval = &local_24;
        iVar10 = getsockopt((int)(src->kev).ident,1,4,__optval,&local_28);
        if (iVar10 < 0) {
          __optval = (uint *)__errno_location();
        }
        uVar11 = *__optval;
      }
      dst->fflags = uVar11;
      pbVar1 = (byte *)((long)&dst->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  uVar12 = (src->kev).flags;
  iVar10 = 0;
  if ((char)uVar12 < '\0') {
    iVar10 = knote_disable(filt,src);
    uVar12 = (src->kev).flags;
  }
  if ((uVar12 & 0x10) != 0) {
    iVar10 = knote_delete(filt,src);
  }
  return iVar10 >> 0x1f | 1;
}

Assistant:

int
evfilt_write_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr)
{
    int ret;
    int serr;
    socklen_t slen = sizeof(serr);
    struct epoll_event * const ev = (struct epoll_event *) ptr;

    epoll_event_dump(ev);
    memcpy(dst, &src->kev, sizeof(*dst));

    /*
     * Fast path for files...
     */
    if (src->kn_flags & KNFL_FILE) goto done;

    if (ev->events & EPOLLHUP)
        dst->flags |= EV_EOF;

    if (ev->events & EPOLLERR) {
        if (src->kn_flags & KNFL_SOCKET) {
            ret = getsockopt(src->kev.ident, SOL_SOCKET, SO_ERROR, &serr, &slen);
            dst->fflags = ((ret < 0) ? errno : serr);
        } else
            dst->fflags = EIO;

        /*
         * The only way we seem to be able to signal an error
         * is by setting EOF on the socket.
         */
        dst->flags |= EV_EOF;
    }

    /* On return, data contains the the amount of space remaining in the write buffer */
    if (!(dst->flags & EV_EOF) && (ioctl(dst->ident, SIOCOUTQ, &dst->data) < 0)) {
            /* race condition with socket close, so ignore this error */
            dbg_puts("ioctl(2) of socket failed");
            dst->data = 0;
    }

done:
    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}